

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O2

RK_S32 get_smallest_poc(H264_DpbBuf_t *p_Dpb,RK_S32 *poc,RK_S32 *pos)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  *pos = -1;
  *poc = 0x7fffffff;
  iVar4 = 0x7fffffff;
  uVar3 = 0xffffffff;
  iVar2 = 0;
  for (uVar5 = 0; uVar5 < p_Dpb->used_size; uVar5 = uVar5 + 1) {
    iVar1 = p_Dpb->fs[uVar5]->poc;
    if (iVar1 < iVar4) {
      uVar3 = uVar5 & 0xffffffff;
    }
    if (iVar1 <= iVar4) {
      iVar4 = iVar1;
    }
    if ((iVar1 < *poc) && (p_Dpb->fs[uVar5]->is_output == 0)) {
      *poc = iVar1;
      *pos = (RK_S32)uVar5;
      iVar2 = 1;
    }
  }
  if (iVar2 == 0) {
    *poc = iVar4;
    *pos = (RK_S32)uVar3;
  }
  return iVar2;
}

Assistant:

static RK_S32 get_smallest_poc(H264_DpbBuf_t *p_Dpb, RK_S32 *poc, RK_S32 *pos)
{
    RK_U32 i = 0;
    RK_S32 find_flag = 0;
    RK_S32 min_pos = -1;
    RK_S32 min_poc = INT_MAX;

    *pos = -1;
    *poc = INT_MAX;
    for (i = 0; i < p_Dpb->used_size; i++) {
        if (min_poc > p_Dpb->fs[i]->poc) {
            min_poc = p_Dpb->fs[i]->poc;
            min_pos = i;
        }
        if ((*poc > p_Dpb->fs[i]->poc) && (!p_Dpb->fs[i]->is_output)) {
            *poc = p_Dpb->fs[i]->poc;
            *pos = i;
            find_flag = 1;
        }
    }
    if (!find_flag) {
        *poc = min_poc;
        *pos = min_pos;
    }

    return find_flag;
}